

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O3

void nn_ws_handshake_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint uVar1;
  undefined8 uVar2;
  nn_queue_item *pnVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  size_t sVar7;
  char *pcVar8;
  uint *hashed_len;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  uint extraout_EDX_06;
  int extraout_EDX_07;
  nn_fsm_fn len;
  undefined4 uVar9;
  nn_fsm_fn p_Var10;
  nn_usock *self_00;
  nn_fsm *pnVar11;
  nn_fsm *pnVar12;
  int *unaff_R12;
  long lVar13;
  nn_fsm **ppnVar14;
  ulong uVar15;
  uint8_t rand_key [16];
  nn_iovec open_request;
  nn_fsm *local_f0;
  nn_queue_item *local_e8;
  int *local_e0;
  nn_fsm **local_d8 [5];
  nn_fsm *local_b0;
  nn_fsm *local_a8;
  nn_fsm *local_a0;
  nn_fsm *local_98;
  nn_fsm *local_90;
  nn_fsm *local_88;
  nn_fsm *local_80;
  nn_fsm *local_78;
  nn_fsm *local_70;
  nn_fsm *local_68;
  nn_fsm *local_60;
  uint8_t local_58 [24];
  nn_iovec local_40;
  
  hashed_len = &switchD_0012fe5f::switchdataD_00135ef8;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src != -2) goto LAB_00130d9c;
    if (type != -2) goto LAB_00130da5;
    if (self[0x33].fn != (nn_fsm_fn)0x0) {
      nn_ws_handshake_handler_cold_35();
LAB_00130b10:
      nn_ws_handshake_handler_cold_42();
LAB_00130b15:
      nn_ws_handshake_handler_cold_36();
LAB_00130b1a:
      nn_ws_handshake_handler_cold_40();
LAB_00130b1f:
      nn_ws_handshake_handler_cold_37();
LAB_00130b24:
      nn_ws_handshake_handler_cold_38();
LAB_00130b29:
      nn_ws_handshake_handler_cold_15();
LAB_00130b2e:
      nn_ws_handshake_handler_cold_30();
LAB_00130b33:
      nn_ws_handshake_handler_cold_14();
LAB_00130b38:
      nn_ws_handshake_handler_cold_29();
LAB_00130b3d:
      nn_ws_handshake_handler_cold_26();
LAB_00130b42:
      nn_ws_handshake_handler_cold_28();
LAB_00130b47:
      nn_ws_handshake_handler_cold_11();
LAB_00130b4c:
      nn_ws_handshake_handler_cold_27();
LAB_00130b51:
      nn_ws_handshake_handler_cold_13();
LAB_00130b56:
      nn_ws_handshake_handler_cold_12();
LAB_00130b5b:
      iVar5 = (int)hashed_len;
      if (*(char *)local_d8[0] == '\0') {
LAB_00130b69:
        if (((((nn_fsm *)local_80->fn != (nn_fsm *)0x0) &&
             (pnVar11 = (nn_fsm *)local_88->fn, pnVar11 != (nn_fsm *)0x0)) &&
            (pnVar3 = local_e8->next, pnVar3 != (nn_queue_item *)0x0)) &&
           (((pnVar12 = (nn_fsm *)local_78->fn, pnVar12 != (nn_fsm *)0x0 &&
             (iVar4 = nn_ws_validate_value("101",(char *)local_80->fn,(size_t)local_90->fn,iVar5),
             iVar4 != 0)) &&
            ((iVar4 = nn_ws_validate_value("websocket",(char *)pnVar11,*(size_t *)local_e0,iVar5),
             iVar4 != 0 &&
             ((iVar4 = nn_ws_validate_value("Upgrade",(char *)pnVar3,(size_t)local_f0->fn,iVar5),
              iVar4 != 0 &&
              (iVar5 = nn_ws_validate_value
                                 ((char *)&self[0x34].stopped.type,(char *)pnVar12,
                                  (size_t)self[0x34].stopped.srcptr,iVar5), iVar5 != 0)))))))) {
LAB_001308fe:
          nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
          *(undefined4 *)&self[1].fn = 8;
          return;
        }
LAB_001309c0:
        nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
        *(undefined4 *)&self[1].fn = 7;
        return;
      }
      nn_ws_handshake_handler_cold_10();
LAB_00130c32:
      if (*(char *)local_d8[0] != '\0') {
        nn_ws_handshake_handler_cold_25();
      }
LAB_00130c41:
      uVar9 = 3;
      if (((*(long *)unaff_R12 != 0) && (pnVar11 = (nn_fsm *)local_90->fn, pnVar11 != (nn_fsm *)0x0)
          ) && ((pnVar3 = local_e8->next, pnVar3 != (nn_queue_item *)0x0 &&
                (((nn_fsm *)local_80->fn != (nn_fsm *)0x0 &&
                 ((nn_fsm *)local_98->fn != (nn_fsm *)0x0)))))) {
        iVar5 = nn_ws_validate_value("13",(char *)local_98->fn,(size_t)local_a0->fn,(int)hashed_len)
        ;
        if (iVar5 == 0) {
          uVar9 = 4;
        }
        else {
          iVar5 = nn_ws_validate_value
                            ("websocket",(char *)pnVar11,*(size_t *)local_e0,(int)hashed_len);
          if ((iVar5 != 0) &&
             (iVar5 = nn_ws_validate_value
                                ("Upgrade",(char *)pnVar3,(size_t)local_f0->fn,(int)hashed_len),
             iVar5 != 0)) {
            pnVar11 = (nn_fsm *)local_a8->fn;
            if (pnVar11 == (nn_fsm *)0x0) {
              iVar5 = nn_pipebase_ispeer((nn_pipebase *)self[4].shutdown_fn,0x10);
              uVar9 = 6;
              if (iVar5 != 0) {
                uVar9 = 0;
              }
              *(undefined4 *)&self[0x35].stopped.item.next = uVar9;
              goto LAB_00130ab1;
            }
            pnVar12 = (nn_fsm *)local_b0->fn;
            lVar13 = 8;
            uVar9 = 7;
            do {
              iVar5 = nn_ws_validate_value
                                (*(char **)((long)&NN_WS_HANDSHAKE_SP_MAP[0].server + lVar13),
                                 (char *)pnVar11,(size_t)pnVar12,(int)hashed_len);
              if (iVar5 != 0) {
                uVar9 = 6;
                if (*(int *)(*(long *)(*(long *)(self[4].shutdown_fn + 0x68) + 0x68) + 4) ==
                    *(int *)((long)&nn_ws_optset_vfptr.getopt + lVar13)) {
                  uVar9 = 0;
                }
                *(undefined4 *)&self[0x35].stopped.item.next = uVar9;
                goto LAB_00130ab1;
              }
              lVar13 = lVar13 + 0x10;
            } while (lVar13 != 0xa8);
          }
        }
      }
      *(undefined4 *)&self[0x35].stopped.item.next = uVar9;
LAB_00130ab1:
      *(undefined4 *)&self[1].fn = 3;
      nn_ws_handshake_server_reply((nn_ws_handshake *)self);
      return;
    }
    if (self[0x33].shutdown_fn < (nn_fsm_fn)0x4) goto LAB_00130b10;
    src = *(int *)&self[3].stopped.srcptr;
    nn_timer_start((nn_timer *)&self[1].shutdown_fn,src);
    iVar5 = *(int *)((long)&self[1].fn + 4);
    if (iVar5 == 2) {
      len = self[0x33].shutdown_fn;
      if (len < (nn_fsm_fn)0x1001) {
        *(undefined4 *)&self[1].fn = 2;
        self_00 = *(nn_usock **)&self[3].stopped.type;
        ppnVar14 = &self[4].owner;
        goto LAB_00130a0e;
      }
      goto LAB_00130b15;
    }
    if (iVar5 == 1) {
      if ((nn_fsm_fn)0x200 < self[0x33].shutdown_fn) goto LAB_00130b1a;
      *(undefined4 *)&self[1].fn = 4;
      nn_random_generate(local_58,0x10);
      hashed_len = (uint *)0x19;
      nn_base64_encode(local_58,0x10,(char *)local_d8,0x19);
      sVar7 = strlen((char *)local_d8);
      if (sVar7 != 0x18) goto LAB_00130b1f;
      iVar5 = nn_ws_handshake_hash_key
                        ((char *)local_d8,0x18,(char *)&self[0x34].stopped.type,(size_t)hashed_len);
      if (iVar5 == 0x1c) {
        uVar1 = *(uint *)(*(long *)(*(long *)(self[4].shutdown_fn + 0x68) + 0x68) + 4);
        hashed_len = (uint *)(ulong)uVar1;
        lVar13 = 8;
        src = 0x149c20;
        do {
          if (*(uint *)((long)&nn_ws_optset_vfptr.getopt + lVar13 + 4) == uVar1) {
            ppnVar14 = &self[4].owner;
            uVar2._0_4_ = self[4].state;
            uVar2._4_4_ = self[4].src;
            sprintf((char *)ppnVar14,
                    "GET %s HTTP/1.1\r\nHost: %s\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Key: %s\r\nSec-WebSocket-Version: 13\r\nSec-WebSocket-Protocol: %s\r\n\r\n"
                    ,uVar2,self[4].srcptr,local_d8,
                    *(undefined8 *)((long)&NN_WS_HANDSHAKE_SP_MAP[0].server + lVar13));
            local_40.iov_len = strlen((char *)ppnVar14);
            local_40.iov_base = ppnVar14;
            nn_usock_send(*(nn_usock **)&self[3].stopped.type,&local_40,1);
            return;
          }
          lVar13 = lVar13 + 0x10;
        } while (lVar13 != 0xa8);
        nn_ws_handshake_handler_cold_39();
        type = extraout_EDX;
        goto switchD_0012fe5f_caseD_5;
      }
      goto LAB_00130b24;
    }
    goto LAB_00130e00;
  case 2:
    if (src == 2) goto LAB_001309ab;
    if (src != 1) goto LAB_00130dd0;
    if (type == 8) {
      return;
    }
    if (type == 5) goto LAB_001309c0;
    if (type == 4) {
      ppnVar14 = &self[4].owner;
      pvVar6 = memchr(ppnVar14,0,0x1000);
      if (pvVar6 == (void *)0x0) goto LAB_00130b2e;
      sVar7 = strlen((char *)ppnVar14);
      if (0xfff < sVar7) goto LAB_00130b38;
      local_d8[0] = ppnVar14;
      pcVar8 = strstr((char *)ppnVar14,"\r\n\r\n");
      if (pcVar8 != (char *)0x0) {
        self[0x34].srcptr = (void *)0x0;
        self[0x34].owner = (nn_fsm *)0x0;
        self[0x34].shutdown_fn = (nn_fsm_fn)0x0;
        self[0x34].state = 0;
        self[0x34].src = 0;
        self[0x33].stopped.item.next = (nn_queue_item *)0x0;
        self[0x34].fn = (nn_fsm_fn)0x0;
        self[0x33].stopped.srcptr = (void *)0x0;
        *(undefined8 *)&self[0x33].stopped.type = 0;
        self[0x33].stopped.fsm = (nn_fsm *)0x0;
        *(undefined8 *)&self[0x33].stopped.src = 0;
        self[0x33].owner = (nn_fsm *)0x0;
        self[0x33].ctx = (nn_ctx *)0x0;
        self[0x33].state = 0;
        self[0x33].src = 0;
        self[0x33].srcptr = (void *)0x0;
        self[0x35].stopped.fsm = (nn_fsm *)0x0;
        *(undefined8 *)&self[0x35].stopped.src = 0;
        *(undefined4 *)&self[0x35].stopped.item.next = 0xffffffff;
        iVar5 = nn_ws_match_token("GET ",(char **)local_d8,0,(int)hashed_len);
        if (iVar5 != 0) {
          hashed_len = (uint *)0x0;
          iVar5 = nn_ws_match_value(" ",(char **)local_d8,0,0,(char **)&self[0x35].stopped,
                                    (size_t *)&self[0x35].stopped.src);
          if (((iVar5 != 0) &&
              (iVar5 = nn_ws_match_token("HTTP/1.1",(char **)local_d8,0,(int)hashed_len), iVar5 != 0
              )) && (iVar5 = nn_ws_match_token("\r\n",(char **)local_d8,0,(int)hashed_len),
                    iVar5 != 0)) {
            unaff_R12 = &self[0x33].state;
            local_78 = (nn_fsm *)&self[0x33].owner;
            local_80 = (nn_fsm *)&self[0x33].stopped;
            local_90 = (nn_fsm *)&self[0x33].stopped.srcptr;
            local_e8 = &self[0x33].stopped.item;
            local_98 = (nn_fsm *)&self[0x34].shutdown_fn;
            local_a8 = (nn_fsm *)&self[0x34].srcptr;
            local_60 = (nn_fsm *)&self[0x33].ctx;
            local_88 = (nn_fsm *)&self[0x33].stopped.src;
            local_e0 = &self[0x33].stopped.type;
            local_f0 = self + 0x34;
            local_a0 = (nn_fsm *)&self[0x34].state;
            local_b0 = (nn_fsm *)&self[0x34].owner;
            local_68 = (nn_fsm *)&self[0x35].stopped.srcptr;
            local_70 = (nn_fsm *)&self[0x35].stopped.type;
            do {
              if (*(char *)local_d8[0] == '\0') goto LAB_00130c41;
              iVar5 = nn_ws_match_token("Host:",(char **)local_d8,1,(int)hashed_len);
              pnVar11 = (nn_fsm *)unaff_R12;
              pnVar12 = (nn_fsm *)&self[0x33].srcptr;
              if (((((iVar5 == 0) &&
                    (iVar5 = nn_ws_match_token("Origin:",(char **)local_d8,1,(int)hashed_len),
                    pnVar11 = local_78, pnVar12 = local_60, iVar5 == 0)) &&
                   ((iVar5 = nn_ws_match_token("Sec-WebSocket-Key:",(char **)local_d8,1,
                                               (int)hashed_len), pnVar11 = local_80,
                    pnVar12 = local_88, iVar5 == 0 &&
                    ((iVar5 = nn_ws_match_token("Upgrade:",(char **)local_d8,1,(int)hashed_len),
                     pnVar11 = local_90, pnVar12 = (nn_fsm *)local_e0, iVar5 == 0 &&
                     (iVar5 = nn_ws_match_token("Connection:",(char **)local_d8,1,(int)hashed_len),
                     pnVar11 = (nn_fsm *)local_e8, pnVar12 = local_f0, iVar5 == 0)))))) &&
                  (iVar5 = nn_ws_match_token("Sec-WebSocket-Version:",(char **)local_d8,1,
                                             (int)hashed_len), pnVar11 = local_98,
                  pnVar12 = local_a0, iVar5 == 0)) &&
                 ((iVar5 = nn_ws_match_token("Sec-WebSocket-Protocol:",(char **)local_d8,1,
                                             (int)hashed_len), pnVar11 = local_a8,
                  pnVar12 = local_b0, iVar5 == 0 &&
                  (iVar5 = nn_ws_match_token("Sec-WebSocket-Extensions:",(char **)local_d8,1,
                                             (int)hashed_len), pnVar11 = local_68,
                  pnVar12 = local_70, iVar5 == 0)))) {
                iVar5 = nn_ws_match_token("\r\n",(char **)local_d8,1,(int)hashed_len);
                if (iVar5 != 0) goto LAB_00130c32;
                pnVar11 = (nn_fsm *)0x0;
                pnVar12 = (nn_fsm *)0x0;
              }
              hashed_len = (uint *)0x1;
              iVar5 = nn_ws_match_value("\r\n",(char **)local_d8,1,1,(char **)pnVar11,
                                        (size_t *)pnVar12);
            } while (iVar5 != 0);
          }
        }
      }
      p_Var10 = self[0x33].shutdown_fn + (long)self[0x33].fn;
      self[0x33].fn = p_Var10;
      if ((nn_fsm_fn)0xfff < p_Var10) goto LAB_00130b42;
      if ((nn_fsm_fn)0x3 < p_Var10) {
        ppnVar14 = (nn_fsm **)((long)ppnVar14 + (long)p_Var10);
        unaff_R12 = (int *)(p_Var10 + (long)((long)&self[4].srcptr + 4));
        uVar15 = 4;
        do {
          iVar5 = bcmp("\r\n\r\n",unaff_R12,uVar15);
          if (iVar5 == 0) {
            if (uVar15 < 4) goto LAB_00130a8c;
            goto LAB_00130b3d;
          }
          unaff_R12 = (int *)((long)unaff_R12 + 1);
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
        uVar15 = 0;
LAB_00130a8c:
        len = (nn_fsm_fn)(4 - uVar15);
        self[0x33].shutdown_fn = len;
        if ((nn_fsm_fn)0x1000 < p_Var10 + (long)len) {
          *(undefined4 *)&self[0x35].stopped.item.next = 1;
          goto LAB_00130ab1;
        }
        goto LAB_00130af6;
      }
      goto LAB_00130b4c;
    }
    goto LAB_00130e13;
  case 3:
    if (src == 2) goto LAB_00130993;
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_001309c0;
      if (type == 3) goto LAB_001308fe;
      nn_ws_handshake_handler_cold_22();
      type = extraout_EDX_00;
      goto switchD_0012fe5f_caseD_4;
    }
    goto LAB_00130db5;
  case 4:
switchD_0012fe5f_caseD_4:
    if (src == 2) goto LAB_0013099f;
    if (src != 1) goto LAB_00130dbe;
    if (type == 8) {
      return;
    }
    if (type == 5) goto LAB_001309c0;
    if (type == 3) {
      *(undefined4 *)&self[1].fn = 5;
      self_00 = *(nn_usock **)&self[3].stopped.type;
      len = self[0x33].shutdown_fn;
      ppnVar14 = (nn_fsm **)((long)&self[0x35].stopped.item.next + 4);
LAB_00130a0e:
      nn_usock_recv(self_00,ppnVar14,(size_t)len,(int *)0x0);
      return;
    }
    goto LAB_00130e0c;
  case 5:
switchD_0012fe5f_caseD_5:
    if (src == 2) {
      if (type == 1) goto LAB_001309c0;
      nn_ws_handshake_handler_cold_9();
      type = extraout_EDX_01;
LAB_00130993:
      if (type == 1) goto LAB_001309c0;
      nn_ws_handshake_handler_cold_21();
      type = extraout_EDX_02;
LAB_0013099f:
      if (type == 1) goto LAB_001309c0;
      nn_ws_handshake_handler_cold_18();
      type = extraout_EDX_03;
LAB_001309ab:
      if (type == 1) goto LAB_001309c0;
      nn_ws_handshake_handler_cold_24();
      type = extraout_EDX_04;
LAB_001309b7:
      if (type == 1) goto LAB_001309c0;
      goto LAB_00130df9;
    }
    if (src != 1) goto LAB_00130dac;
    if (type == 8) {
      return;
    }
    if (type == 5) goto LAB_001309c0;
    if (type == 4) {
      ppnVar14 = (nn_fsm **)((long)&self[0x35].stopped.item.next + 4);
      pvVar6 = memchr(ppnVar14,0,0x200);
      if (pvVar6 == (void *)0x0) goto LAB_00130b29;
      sVar7 = strlen((char *)ppnVar14);
      if (0x1ff < sVar7) goto LAB_00130b33;
      local_d8[0] = ppnVar14;
      pcVar8 = strstr((char *)ppnVar14,"\r\n\r\n");
      if (pcVar8 != (char *)0x0) {
        *(undefined8 *)&self[0x34].stopped.src = 0;
        self[0x34].stopped.srcptr = (void *)0x0;
        self[0x34].ctx = (nn_ctx *)0x0;
        self[0x34].stopped.fsm = (nn_fsm *)0x0;
        self[0x34].srcptr = (void *)0x0;
        self[0x34].owner = (nn_fsm *)0x0;
        self[0x34].shutdown_fn = (nn_fsm_fn)0x0;
        self[0x34].state = 0;
        self[0x34].src = 0;
        self[0x33].stopped.item.next = (nn_queue_item *)0x0;
        self[0x34].fn = (nn_fsm_fn)0x0;
        self[0x33].stopped.srcptr = (void *)0x0;
        *(undefined8 *)&self[0x33].stopped.type = 0;
        self[0x35].state = 0;
        self[0x35].src = 0;
        self[0x35].srcptr = (void *)0x0;
        self[0x35].owner = (nn_fsm *)0x0;
        self[0x35].ctx = (nn_ctx *)0x0;
        iVar5 = nn_ws_match_token("HTTP/1.1 ",(char **)local_d8,0,(int)hashed_len);
        if (iVar5 != 0) {
          local_80 = (nn_fsm *)&self[0x35].state;
          local_90 = (nn_fsm *)&self[0x35].srcptr;
          hashed_len = (uint *)0x0;
          iVar5 = nn_ws_match_value(" ",(char **)local_d8,0,0,(char **)local_80,(size_t *)local_90);
          if (iVar5 != 0) {
            hashed_len = (uint *)0x0;
            iVar5 = nn_ws_match_value("\r\n",(char **)local_d8,0,0,(char **)&self[0x35].owner,
                                      (size_t *)&self[0x35].ctx);
            if (iVar5 != 0) {
              local_78 = (nn_fsm *)&self[0x34].stopped.src;
              local_88 = (nn_fsm *)&self[0x33].stopped.srcptr;
              local_e8 = &self[0x33].stopped.item;
              local_98 = (nn_fsm *)&self[0x34].shutdown_fn;
              local_a8 = (nn_fsm *)&self[0x34].srcptr;
              local_60 = (nn_fsm *)&self[0x34].stopped.srcptr;
              local_e0 = &self[0x33].stopped.type;
              local_f0 = self + 0x34;
              local_a0 = (nn_fsm *)&self[0x34].state;
              local_b0 = (nn_fsm *)&self[0x34].owner;
              local_68 = (nn_fsm *)&self[0x35].stopped.srcptr;
              local_70 = (nn_fsm *)&self[0x35].stopped.type;
              unaff_R12 = (int *)0x136267;
              do {
                iVar5 = (int)hashed_len;
                if (*(char *)local_d8[0] == '\0') goto LAB_00130b69;
                iVar5 = nn_ws_match_token("Server:",(char **)local_d8,1,iVar5);
                pnVar11 = (nn_fsm *)&self[0x34].ctx;
                pnVar12 = (nn_fsm *)&self[0x34].stopped;
                if (((((iVar5 == 0) &&
                      (iVar5 = nn_ws_match_token("Sec-WebSocket-Accept:",(char **)local_d8,1,
                                                 (int)hashed_len), pnVar11 = local_78,
                      pnVar12 = local_60, iVar5 == 0)) &&
                     (iVar5 = nn_ws_match_token("Upgrade:",(char **)local_d8,1,(int)hashed_len),
                     pnVar11 = local_88, pnVar12 = (nn_fsm *)local_e0, iVar5 == 0)) &&
                    ((iVar5 = nn_ws_match_token("Connection:",(char **)local_d8,1,(int)hashed_len),
                     pnVar11 = (nn_fsm *)local_e8, pnVar12 = local_f0, iVar5 == 0 &&
                     (iVar5 = nn_ws_match_token("Sec-WebSocket-Version-Server:",(char **)local_d8,1,
                                                (int)hashed_len), pnVar11 = local_98,
                     pnVar12 = local_a0, iVar5 == 0)))) &&
                   ((iVar5 = nn_ws_match_token("Sec-WebSocket-Protocol-Server:",(char **)local_d8,1,
                                               (int)hashed_len), pnVar11 = local_a8,
                    pnVar12 = local_b0, iVar5 == 0 &&
                    (iVar5 = nn_ws_match_token("Sec-WebSocket-Extensions:",(char **)local_d8,1,
                                               (int)hashed_len), pnVar11 = local_68,
                    pnVar12 = local_70, iVar5 == 0)))) {
                  iVar5 = nn_ws_match_token("\r\n",(char **)local_d8,1,(int)hashed_len);
                  if (iVar5 != 0) goto LAB_00130b5b;
                  pnVar11 = (nn_fsm *)0x0;
                  pnVar12 = (nn_fsm *)0x0;
                }
                hashed_len = (uint *)0x1;
                iVar5 = nn_ws_match_value("\r\n",(char **)local_d8,1,1,(char **)pnVar11,
                                          (size_t *)pnVar12);
              } while (iVar5 != 0);
            }
          }
        }
      }
      p_Var10 = self[0x33].shutdown_fn + (long)self[0x33].fn;
      self[0x33].fn = p_Var10;
      if ((nn_fsm_fn)0x1ff < p_Var10) goto LAB_00130b51;
      if ((nn_fsm_fn)0x3 < p_Var10) {
        ppnVar14 = (nn_fsm **)((long)ppnVar14 + (long)p_Var10);
        unaff_R12 = (int *)(p_Var10 + (long)&self[0x35].stopped.item);
        uVar15 = 4;
        do {
          iVar5 = bcmp("\r\n\r\n",unaff_R12,uVar15);
          if (iVar5 == 0) {
            if (uVar15 < 4) goto LAB_00130ad7;
            goto LAB_00130b47;
          }
          unaff_R12 = (int *)((long)unaff_R12 + 1);
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
        uVar15 = 0;
LAB_00130ad7:
        len = (nn_fsm_fn)(4 - uVar15);
        self[0x33].shutdown_fn = len;
        if ((nn_fsm_fn)0x200 < p_Var10 + (long)len) goto LAB_001309c0;
LAB_00130af6:
        pnVar3 = &self[0x32].stopped.item;
        *(int *)&pnVar3->next = *(int *)&pnVar3->next + 1;
        self_00 = *(nn_usock **)&self[3].stopped.type;
        goto LAB_00130a0e;
      }
      goto LAB_00130b56;
    }
    goto LAB_00130e05;
  case 6:
    if (src == 2) goto LAB_001309b7;
    if (src != 1) goto LAB_00130dd9;
    if (type == 8) {
      return;
    }
    if (type == 5) goto LAB_001309c0;
    if (type == 3) goto LAB_001308fe;
    break;
  case 7:
    if (src == 1) {
      return;
    }
    if (src != 2) goto LAB_00130de2;
    if (type == 2) {
      nn_usock_swap_owner(*(nn_usock **)&self[3].stopped.type,(nn_fsm_owner *)&self[3].stopped.item)
      ;
      *(undefined8 *)&self[3].stopped.type = 0;
      *(undefined4 *)&self[3].stopped.item.next = 0xffffffff;
      self[4].fn = (nn_fsm_fn)0x0;
      *(undefined4 *)&self[1].fn = 9;
      iVar5 = 2;
LAB_00130971:
      nn_fsm_raise(self,(nn_fsm_event *)&self[0x3b].stopped.type,iVar5);
      return;
    }
    goto LAB_00130df2;
  case 8:
    if (src == 1) {
      return;
    }
    if (src != 2) goto LAB_00130dc7;
    if (type == 2) {
      nn_usock_swap_owner(*(nn_usock **)&self[3].stopped.type,(nn_fsm_owner *)&self[3].stopped.item)
      ;
      *(undefined8 *)&self[3].stopped.type = 0;
      *(undefined4 *)&self[3].stopped.item.next = 0xffffffff;
      self[4].fn = (nn_fsm_fn)0x0;
      *(undefined4 *)&self[1].fn = 9;
      iVar5 = 1;
      goto LAB_00130971;
    }
    goto LAB_00130deb;
  default:
    nn_ws_handshake_handler_cold_43();
  case 9:
    nn_ws_handshake_handler_cold_1();
LAB_00130d9c:
    nn_ws_handshake_handler_cold_33();
LAB_00130da5:
    nn_ws_handshake_handler_cold_34();
LAB_00130dac:
    nn_ws_handshake_handler_cold_17();
LAB_00130db5:
    nn_ws_handshake_handler_cold_23();
LAB_00130dbe:
    nn_ws_handshake_handler_cold_20();
LAB_00130dc7:
    nn_ws_handshake_handler_cold_3();
LAB_00130dd0:
    nn_ws_handshake_handler_cold_32();
LAB_00130dd9:
    nn_ws_handshake_handler_cold_8();
    type = extraout_EDX_05;
LAB_00130de2:
    src = type;
    nn_ws_handshake_handler_cold_5();
LAB_00130deb:
    nn_ws_handshake_handler_cold_2();
LAB_00130df2:
    nn_ws_handshake_handler_cold_4();
LAB_00130df9:
    nn_ws_handshake_handler_cold_6();
LAB_00130e00:
    nn_ws_handshake_handler_cold_41();
LAB_00130e05:
    nn_ws_handshake_handler_cold_16();
LAB_00130e0c:
    nn_ws_handshake_handler_cold_19();
LAB_00130e13:
    nn_ws_handshake_handler_cold_31();
    type = extraout_EDX_06;
  }
  pnVar11 = (nn_fsm *)(ulong)(uint)type;
  nn_ws_handshake_handler_cold_7();
  if (extraout_EDX_07 != -3 || src != -2) {
    if (*(int *)&pnVar11[1].fn == 10) goto LAB_00130e50;
    nn_ws_handshake_shutdown_cold_1();
  }
  nn_timer_stop((nn_timer *)&pnVar11[1].shutdown_fn);
  *(undefined4 *)&pnVar11[1].fn = 10;
LAB_00130e50:
  iVar5 = nn_timer_isidle((nn_timer *)&pnVar11[1].shutdown_fn);
  if (iVar5 != 0) {
    *(undefined4 *)&pnVar11[1].fn = 1;
    nn_fsm_stopped(pnVar11,3);
    return;
  }
  return;
}

Assistant:

static void nn_ws_handshake_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ws_handshake *handshaker;

    size_t i;

    handshaker = nn_cont (self, struct nn_ws_handshake, fsm);

    switch (handshaker->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_assert (handshaker->recv_pos == 0);
                nn_assert (handshaker->recv_len >= NN_WS_HANDSHAKE_TERMSEQ_LEN);

                nn_timer_start (&handshaker->timer, handshaker->timeout);

                switch (handshaker->mode) {
                case NN_WS_CLIENT:
                    /*  Send opening handshake to server. */
                    nn_assert (handshaker->recv_len <=
                        sizeof (handshaker->response));
                    handshaker->state = NN_WS_HANDSHAKE_STATE_CLIENT_SEND;
                    nn_ws_handshake_client_request (handshaker);
                    return;
                case NN_WS_SERVER:
                    /*  Begin receiving opening handshake from client. */
                    nn_assert (handshaker->recv_len <=
                        sizeof (handshaker->opening_hs));
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_RECV;
                    nn_usock_recv (handshaker->usock, handshaker->opening_hs,
                        handshaker->recv_len, NULL);
                    return;
                default:
                    /*  Unexpected mode. */
                    nn_assert (0);
                    return;
                }

            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  SERVER_RECV state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_SERVER_RECV:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:
                /*  Parse bytes received thus far. */
                switch (nn_ws_handshake_parse_client_opening (handshaker)) {
                case NN_WS_HANDSHAKE_INVALID:
                    /*  Opening handshake parsed successfully but does not
                        contain valid values. Respond failure to client. */
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                    nn_ws_handshake_server_reply (handshaker);
                    return;
                case NN_WS_HANDSHAKE_VALID:
                    /*  Opening handshake parsed successfully, and is valid.
                        Respond success to client. */
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                    nn_ws_handshake_server_reply (handshaker);
                    return;
                case NN_WS_HANDSHAKE_RECV_MORE:
                    /*  Not enough bytes have been received to determine
                        validity; remain in the receive state, and retrieve
                        more bytes from client. */
                    handshaker->recv_pos += handshaker->recv_len;

                    /*  Validate the previous recv operation. */
                    nn_assert (handshaker->recv_pos <
                        sizeof (handshaker->opening_hs));

                    /*  Ensure we can back-track at least the length of the
                        termination sequence to determine how many bytes to
                        receive on the next retry. This is an assertion, not
                        a conditional, since under no condition is it
                        necessary to initially receive so few bytes. */
                    nn_assert (handshaker->recv_pos >=
                        (int) NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    /*  We only compare if we have at least one byte to
                        compare against.  When i drops to zero, it means
                        we don't have any bytes to match against, and it is
                        automatically true. */
                    for (i = NN_WS_HANDSHAKE_TERMSEQ_LEN; i > 0; i--) {
                        if (memcmp (NN_WS_HANDSHAKE_TERMSEQ,
                            handshaker->opening_hs + handshaker->recv_pos - i,
                            i) == 0) {
                            break;
                        }
                    }

                    nn_assert (i < NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    handshaker->recv_len = NN_WS_HANDSHAKE_TERMSEQ_LEN - i;

                    /*  In the unlikely case the client would overflow what we
                        assumed was a sufficiently-large buffer to receive the
                        handshake, we fail the client. */
                    if (handshaker->recv_len + handshaker->recv_pos >
                        sizeof (handshaker->opening_hs)) {
                        handshaker->response_code =
                            NN_WS_HANDSHAKE_RESPONSE_TOO_BIG;
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                        nn_ws_handshake_server_reply (handshaker);
                    }
                    else {
                        handshaker->retries++;
                        nn_usock_recv (handshaker->usock,
                            handshaker->opening_hs + handshaker->recv_pos,
                            handshaker->recv_len, NULL);
                    }
                    return;
                default:
                    nn_fsm_error ("Unexpected handshake result",
                        handshaker->state, src, type);
                }
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  SERVER_REPLY state.                                                       */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_SERVER_REPLY:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  As per RFC 6455 4.2.2, the handshake is now complete
                    and the connection is immediately ready for send/recv. */
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  CLIENT_SEND state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_CLIENT_SEND:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                handshaker->state = NN_WS_HANDSHAKE_STATE_CLIENT_RECV;
                nn_usock_recv (handshaker->usock, handshaker->response,
                    handshaker->recv_len, NULL);
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  CLIENT_RECV state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_CLIENT_RECV:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:
                /*  Parse bytes received thus far. */
                switch (nn_ws_handshake_parse_server_response (handshaker)) {
                case NN_WS_HANDSHAKE_INVALID:
                    /*  Opening handshake parsed successfully but does not
                        contain valid values. Fail connection. */
                        nn_timer_stop (&handshaker->timer);
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                    return;
                case NN_WS_HANDSHAKE_VALID:
                    /*  As per RFC 6455 4.2.2, the handshake is now complete
                        and the connection is immediately ready for send/recv. */
                    nn_timer_stop (&handshaker->timer);
                    handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
                    return;
                case NN_WS_HANDSHAKE_RECV_MORE:
                    /*  Not enough bytes have been received to determine
                        validity; remain in the receive state, and retrieve
                        more bytes from client. */
                    handshaker->recv_pos += handshaker->recv_len;

                    /*  Validate the previous recv operation. */
                    nn_assert (handshaker->recv_pos <
                        sizeof (handshaker->response));

                    /*  Ensure we can back-track at least the length of the
                        termination sequence to determine how many bytes to
                        receive on the next retry. This is an assertion, not
                        a conditional, since under no condition is it
                        necessary to initially receive so few bytes. */
                    nn_assert (handshaker->recv_pos >=
                        (int) NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    /*  If i goes to 0, it no need to compare. */
                    for (i = NN_WS_HANDSHAKE_TERMSEQ_LEN; i > 0; i--) {
                        if (memcmp (NN_WS_HANDSHAKE_TERMSEQ,
                            handshaker->response + handshaker->recv_pos - i,
                            i) == 0) {
                            break;
                        }
                    }

                    nn_assert (i < NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    handshaker->recv_len = NN_WS_HANDSHAKE_TERMSEQ_LEN - i;

                    /*  In the unlikely case the client would overflow what we
                        assumed was a sufficiently-large buffer to receive the
                        handshake, we fail the connection. */
                    if (handshaker->recv_len + handshaker->recv_pos >
                        sizeof (handshaker->response)) {
                        nn_timer_stop (&handshaker->timer);
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                    }
                    else {
                        handshaker->retries++;
                        nn_usock_recv (handshaker->usock,
                            handshaker->response + handshaker->recv_pos,
                            handshaker->recv_len, NULL);
                    }
                    return;
                default:
                    nn_fsm_error ("Unexpected handshake result",
                        handshaker->state, src, type);
                }
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  HANDSHAKE_SENT state.                                                     */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_HANDSHAKE_SENT:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  As per RFC 6455 4.2.2, the handshake is now complete
                    and the connection is immediately ready for send/recv. */
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_ERROR state.                                               */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            /*  Ignore. The only circumstance the client would send bytes is
                to notify the server it is closing the connection. Wait for the
                socket to eventually error. */
            return;

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_ws_handshake_leave (handshaker, NN_WS_HANDSHAKE_ERROR);
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_DONE state.                                                */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            /*  Ignore. The only circumstance the client would send bytes is
                to notify the server it is closing the connection. Wait for the
                socket to eventually error. */
            return;

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_ws_handshake_leave (handshaker, NN_WS_HANDSHAKE_OK);
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The header exchange was either done successfully of failed. There's       */
/*  nothing that can be done in this state except stopping the object.        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_DONE:
        nn_fsm_bad_source (handshaker->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (handshaker->state, src, type);
    }
}